

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ClosePopupsOverWindow(ImGuiWindow *ref_window,bool restore_focus_to_window_under_popup)

{
  ImGuiWindow **ppIVar1;
  uint uVar2;
  ImGuiPopupData *pIVar3;
  ImGuiWindow *pIVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  bool bVar9;
  ImGuiWindow *pIVar10;
  ulong uVar11;
  
  uVar2 = (GImGui->OpenPopupStack).Size;
  uVar6 = (ulong)uVar2;
  if (uVar6 != 0) {
    uVar11 = 0;
    if (0 < (int)uVar2 && ref_window != (ImGuiWindow *)0x0) {
      pIVar3 = (GImGui->OpenPopupStack).Data;
      uVar11 = 0;
      do {
        pIVar4 = pIVar3[uVar11].Window;
        if ((pIVar4 != (ImGuiWindow *)0x0) && ((pIVar4->Flags & 0x1000000) == 0)) {
          bVar9 = false;
          uVar7 = uVar11;
          do {
            pIVar4 = pIVar3[uVar7].Window;
            if (pIVar4 == (ImGuiWindow *)0x0) {
              bVar5 = true;
            }
            else {
              pIVar10 = ref_window;
              if (ref_window->RootWindow == pIVar4) {
                bVar5 = false;
LAB_001e6a90:
                bVar9 = true;
              }
              else {
                do {
                  bVar5 = pIVar10 != pIVar4;
                  if (pIVar10 == pIVar4) goto LAB_001e6a90;
                  ppIVar1 = &pIVar10->ParentWindowInBeginStack;
                  pIVar10 = *ppIVar1;
                } while (*ppIVar1 != (ImGuiWindow *)0x0);
              }
            }
          } while ((bVar5) && (uVar7 = uVar7 + 1, uVar7 < uVar6));
          if (!bVar9) goto LAB_001e6ab1;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar6);
      uVar11 = (ulong)uVar2;
    }
LAB_001e6ab1:
    if ((int)uVar11 < (int)uVar2) {
      if ((GImGui->DebugLogFlags & 4) != 0) {
        if (ref_window == (ImGuiWindow *)0x0) {
          pcVar8 = "<NULL>";
        }
        else {
          pcVar8 = ref_window->Name;
        }
        DebugLog("[popup] ClosePopupsOverWindow(\"%s\")\n",pcVar8);
      }
      ClosePopupToLevel((int)uVar11,restore_focus_to_window_under_popup);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::ClosePopupsOverWindow(ImGuiWindow* ref_window, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.Size == 0)
        return;

    // Don't close our own child popup windows.
    int popup_count_to_keep = 0;
    if (ref_window)
    {
        // Find the highest popup which is a descendant of the reference window (generally reference window = NavWindow)
        for (; popup_count_to_keep < g.OpenPopupStack.Size; popup_count_to_keep++)
        {
            ImGuiPopupData& popup = g.OpenPopupStack[popup_count_to_keep];
            if (!popup.Window)
                continue;
            IM_ASSERT((popup.Window->Flags & ImGuiWindowFlags_Popup) != 0);
            if (popup.Window->Flags & ImGuiWindowFlags_ChildWindow)
                continue;

            // Trim the stack unless the popup is a direct parent of the reference window (the reference window is often the NavWindow)
            // - With this stack of window, clicking/focusing Popup1 will close Popup2 and Popup3:
            //     Window -> Popup1 -> Popup2 -> Popup3
            // - Each popups may contain child windows, which is why we compare ->RootWindow!
            //     Window -> Popup1 -> Popup1_Child -> Popup2 -> Popup2_Child
            bool ref_window_is_descendent_of_popup = false;
            for (int n = popup_count_to_keep; n < g.OpenPopupStack.Size; n++)
                if (ImGuiWindow* popup_window = g.OpenPopupStack[n].Window)
                    if (IsWindowWithinBeginStackOf(ref_window, popup_window))
                    {
                        ref_window_is_descendent_of_popup = true;
                        break;
                    }
            if (!ref_window_is_descendent_of_popup)
                break;
        }
    }
    if (popup_count_to_keep < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the statement below
    {
        IMGUI_DEBUG_LOG_POPUP("[popup] ClosePopupsOverWindow(\"%s\")\n", ref_window ? ref_window->Name : "<NULL>");
        ClosePopupToLevel(popup_count_to_keep, restore_focus_to_window_under_popup);
    }
}